

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O0

SquareMatrix<double> __thiscall
qclab::dense::kron<double>(dense *this,SquareMatrix<double> *A,SquareMatrix<double> *B)

{
  int64_t iVar1;
  int64_t iVar2;
  data_type extraout_RDX;
  SquareMatrix<double> SVar3;
  SquareMatrix<double> *B_local;
  SquareMatrix<double> *A_local;
  SquareMatrix<double> *kronAB;
  
  iVar1 = SquareMatrix<double>::rows(A);
  iVar2 = SquareMatrix<double>::rows(B);
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,iVar1 * iVar2);
  kron<qclab::dense::SquareMatrix<double>>(A,B,(SquareMatrix<double> *)this);
  SVar3.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

SquareMatrix< T > kron( const SquareMatrix< T >& A ,
                            const SquareMatrix< T >& B ) {
      SquareMatrix< T > kronAB( A.rows() * B.rows() ) ;
      kron( A , B , kronAB ) ;
      return kronAB ;
    }